

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t archive_match_include_date(archive *_a,wchar_t flag,char *datestr)

{
  wchar_t wVar1;
  time_t mtime_sec;
  char *fmt;
  
  wVar1 = validate_time_flag(_a,flag,"archive_match_include_date");
  if (wVar1 == L'\0') {
    if ((datestr == (char *)0x0) || (*datestr == '\0')) {
      fmt = "date is empty";
    }
    else {
      mtime_sec = __archive_get_date((time_t)_a[1].sconv,datestr);
      if (mtime_sec != -1) {
        set_timefilter((archive_match *)_a,flag,mtime_sec,0,mtime_sec,0);
        return L'\0';
      }
      fmt = "invalid date string";
    }
    archive_set_error(_a,0x16,fmt);
    wVar1 = L'\xffffffe7';
  }
  return wVar1;
}

Assistant:

int
archive_match_include_date(struct archive *_a, int flag,
    const char *datestr)
{
	int r;

	r = validate_time_flag(_a, flag, "archive_match_include_date");
	if (r != ARCHIVE_OK)
		return (r);
	return set_timefilter_date((struct archive_match *)_a, flag, datestr);
}